

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

FxExpression * __thiscall FxIntCast::Resolve(FxIntCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PString *pPVar2;
  PInt *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxExpression *this_00;
  long lVar5;
  FxIntCast *this_01;
  int iVar6;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *pTVar7;
  FxExpression *x;
  ExpVal constval;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar4 = (*this->basex->_vptr_FxExpression[2])();
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    if (this->basex == (FxExpression *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxIntCast *)0x0;
    }
    else {
      iVar4 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
      this_01 = (FxIntCast *)this->basex;
      pPVar1 = (this_01->super_FxExpression).ValueType;
      if (iVar4 == 0) {
        if (pPVar1 == (PType *)TypeName) {
          iVar4 = (*(this_01->super_FxExpression)._vptr_FxExpression[3])(this_01);
          if ((char)iVar4 == '\0') {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,3,
                       "Numeric type expected, got a name");
          }
          else {
            pPVar2 = (PString *)this->basex[1]._vptr_FxExpression;
            pTVar7 = &this->basex[1].JumpAddresses;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_30,(FString *)pTVar7);
            }
            else {
              local_30.Chars = (char *)pTVar7->Array;
            }
            lVar5 = (long)(int)local_30.Chars;
            if (pPVar2 != (PString *)TypeName) {
              lVar5 = 0;
            }
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,3,
                       "Numeric type expected, got \"%s\"",FName::NameData.NameArray[lVar5].Text);
            if (pPVar2 == TypeString) {
              FString::~FString(&local_30);
            }
          }
          this_01 = (FxIntCast *)operator_new(0x48);
          FxExpression::FxExpression
                    ((FxExpression *)this_01,&(this->super_FxExpression).ScriptPosition);
          (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0
          ;
          pPVar3 = TypeSInt32;
          this_01->basex = (FxExpression *)TypeSInt32;
          *(undefined4 *)&this_01[1].super_FxExpression._vptr_FxExpression = 0;
          (this_01->super_FxExpression).ValueType = (PType *)pPVar3;
          (this_01->super_FxExpression).isresolved = true;
        }
        else {
          this->basex = (FxExpression *)0x0;
        }
      }
      else {
        iVar4 = (**(code **)(*(long *)&pPVar1->super_DObject + 0x90))();
        if (iVar4 == 1) {
          iVar4 = (*this->basex->_vptr_FxExpression[3])();
          if ((char)iVar4 == '\0') {
            return &this->super_FxExpression;
          }
          pPVar2 = (PString *)this->basex[1]._vptr_FxExpression;
          pTVar7 = &this->basex[1].JumpAddresses;
          if (pPVar2 == TypeString) {
            FString::AttachToOther(&local_30,(FString *)pTVar7);
          }
          else {
            local_30.Chars = (char *)pTVar7->Array;
          }
          this_00 = (FxExpression *)operator_new(0x48);
          iVar4 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
          if (iVar4 == 1) {
            iVar6 = (int)(double)local_30.Chars;
          }
          else {
            iVar6 = 0;
            if (iVar4 == 0) {
              iVar6 = (int)local_30.Chars;
            }
          }
          FxExpression::FxExpression(this_00,&(this->super_FxExpression).ScriptPosition);
          this_00->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0;
          pPVar3 = TypeSInt32;
          *(PInt **)(this_00 + 1) = TypeSInt32;
          this_00->ValueType = (PType *)pPVar3;
          *(int *)&this_00[1].JumpAddresses.Array = iVar6;
          this_00->isresolved = true;
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          if (pPVar2 != TypeString) {
            return this_00;
          }
          FString::~FString(&local_30);
          return this_00;
        }
        this_01 = (FxIntCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = this_01;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxIntCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			FxExpression *x = basex;
			basex = NULL;
			delete this;
			return x;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant())	ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression * x = new FxConstant(0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetInt(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return NULL;
}